

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

void __thiscall flatbuffers::ToStringVisitor::EndSequence(ToStringVisitor *this)

{
  ToStringVisitor *this_local;
  
  std::__cxx11::string::operator+=((string *)&this->s,(string *)&this->d);
  this->indent_level = this->indent_level - 1;
  append_indent(this);
  std::__cxx11::string::operator+=((string *)&this->s,"}");
  return;
}

Assistant:

void EndSequence() {
    s += d;
    indent_level--;
    append_indent();
    s += "}";
  }